

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  int iVar1;
  long lVar2;
  Index IVar3;
  
  IVar3 = BindingHash::FindIndex(&this->module_bindings,var);
  if ((ulong)IVar3 < (ulong)(*(long *)&this->field_0x8 - *(long *)this >> 3)) {
    lVar2 = *(long *)(*(long *)this + (ulong)IVar3 * 8);
    iVar1 = *(int *)(lVar2 + 8);
    if ((iVar1 == 1) || (iVar1 == 0)) {
      return (Module *)(lVar2 + 0x10);
    }
  }
  return (Module *)0x0;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = commands[index].get();
  if (isa<ModuleCommand>(command)) {
    return &cast<ModuleCommand>(command)->module;
  } else if (isa<ScriptModuleCommand>(command)) {
    return &cast<ScriptModuleCommand>(command)->module;
  }
  return nullptr;
}